

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

Var Js::JavascriptExternalFunction::TTDReplayDummyExternalMethod
              (Var callee,Var *args,USHORT cargs,StdCallJavascriptMethodInfo *info,
              void *callbackState)

{
  bool bVar1;
  Type *this;
  ScriptContext *this_00;
  ThreadContext *pTVar2;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar3;
  EventLog *elog;
  ScriptContext *scriptContext;
  JavascriptExternalFunction *externalFunction;
  void *callbackState_local;
  StdCallJavascriptMethodInfo *info_local;
  USHORT cargs_local;
  Var *args_local;
  Var callee_local;
  
  this = Memory::WriteBarrierPtr<Js::Type>::operator->
                   ((WriteBarrierPtr<Js::Type> *)((long)callee + 8));
  this_00 = Js::Type::GetScriptContext(this);
  pTVar2 = ScriptContext::GetThreadContext(this_00);
  if (pTVar2->TTDLog == (EventLog *)0x0) {
    TTDAbort_unrecoverable_error("How did this get created then???");
  }
  bVar1 = TTD::EventLog::IsDebugModeFlagSet(pTVar2->TTDLog);
  if (!bVar1) {
    TTDAbort_unrecoverable_error("This should never be reached in pure replay mode!!!");
  }
  this_01 = ScriptContext::GetLibrary(this_00);
  pRVar3 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  return pRVar3;
}

Assistant:

Var __stdcall JavascriptExternalFunction::TTDReplayDummyExternalMethod(Var callee, Var *args, USHORT cargs, StdCallJavascriptMethodInfo *info, void *callbackState)
    {
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(callee);

        ScriptContext* scriptContext = externalFunction->type->GetScriptContext();
        TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;
        TTDAssert(elog != nullptr, "How did this get created then???");

        //If this flag is set then this is ok (the debugger may be evaluating this so just return undef -- otherwise this is an error
        if(!elog->IsDebugModeFlagSet())
        {
            TTDAssert(false, "This should never be reached in pure replay mode!!!");
            return nullptr;
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }